

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImVec2 IVar3;
  long lVar4;
  ImDrawIdx IVar5;
  long lVar6;
  ulong uVar7;
  ImDrawIdx *pIVar8;
  int iVar9;
  ImDrawVert *pIVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ImDrawIdx IVar14;
  uint uVar15;
  ImDrawIdx IVar16;
  float fVar17;
  float fVar20;
  ImVec2 IVar18;
  ImVec2 IVar19;
  float fVar21;
  float fVar22;
  float afStack_48 [2];
  ulong local_40;
  uint local_38;
  uint local_34;
  
  if (2 < points_count) {
    IVar3 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      pIVar10 = this->_VtxWritePtr;
      uVar7 = 0;
      do {
        pIVar10->pos = points[uVar7];
        this->_VtxWritePtr->uv = IVar3;
        pIVar10 = this->_VtxWritePtr;
        pIVar10->col = col;
        pIVar10 = pIVar10 + 1;
        this->_VtxWritePtr = pIVar10;
        uVar7 = uVar7 + 1;
      } while ((uint)points_count != uVar7);
      uVar15 = this->_VtxCurrentIdx;
      pIVar8 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      iVar12 = uVar15 + 2;
      do {
        *pIVar8 = (ImDrawIdx)uVar15;
        pIVar8[1] = (ImDrawIdx)iVar12 - 1;
        pIVar8[2] = (ImDrawIdx)iVar12;
        pIVar8 = pIVar8 + 3;
        iVar12 = iVar12 + 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      this->_IdxWritePtr = pIVar8;
      this->_VtxCurrentIdx = uVar15 + (points_count & 0xffffU);
    }
    else {
      local_38 = col & 0xffffff;
      local_34 = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_34);
      uVar15 = this->_VtxCurrentIdx;
      IVar5 = (ImDrawIdx)uVar15;
      pIVar8 = this->_IdxWritePtr;
      iVar12 = points_count + -2;
      iVar9 = uVar15 + 2;
      do {
        *pIVar8 = IVar5;
        pIVar8[1] = (ImDrawIdx)iVar9;
        iVar9 = iVar9 + 2;
        pIVar8[2] = (ImDrawIdx)iVar9;
        pIVar8 = pIVar8 + 3;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      this->_IdxWritePtr = pIVar8;
      uVar11 = (ulong)(uint)points_count;
      lVar4 = -(uVar11 * 8 + 0xf & 0xfffffffffffffff0);
      lVar6 = lVar4 + -0x48;
      iVar9 = points_count + -1;
      uVar7 = 0;
      iVar12 = iVar9;
      do {
        lVar13 = (long)iVar12;
        fVar17 = points[uVar7].x - points[lVar13].x;
        fVar20 = points[uVar7].y - points[lVar13].y;
        fVar21 = fVar17 * fVar17 + fVar20 * fVar20;
        if (0.0 < fVar21) {
          fVar21 = 1.0 / SQRT(fVar21);
          fVar17 = fVar17 * fVar21;
          fVar20 = fVar20 * fVar21;
        }
        *(float *)((long)afStack_48 + lVar13 * 8 + lVar6 + 0x48) = fVar20;
        *(float *)((long)afStack_48 + lVar13 * 8 + lVar4 + 4) = -fVar17;
        iVar12 = (int)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar11 != uVar7);
      pIVar10 = this->_VtxWritePtr;
      uVar7 = 0;
      local_40 = (ulong)uVar15;
      do {
        uVar1 = *(undefined8 *)((long)afStack_48 + (long)iVar9 * 8 + lVar6 + 0x48);
        uVar2 = *(undefined8 *)((long)afStack_48 + uVar7 * 8 + lVar6 + 0x48);
        fVar20 = ((float)uVar2 + (float)uVar1) * 0.5;
        fVar21 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar22 = fVar20 * fVar20 + fVar21 * fVar21;
        fVar17 = 0.5;
        if (0.5 <= fVar22) {
          fVar17 = fVar22;
        }
        fVar20 = (1.0 / fVar17) * fVar20 * 0.5;
        fVar17 = (1.0 / fVar17) * fVar21 * 0.5;
        IVar18.x = points[uVar7].x - fVar20;
        IVar18.y = points[uVar7].y - fVar17;
        pIVar10->pos = IVar18;
        pIVar10->uv = IVar3;
        pIVar10 = this->_VtxWritePtr;
        pIVar10->col = col;
        IVar19.x = points[uVar7].x + fVar20;
        IVar19.y = points[uVar7].y + fVar17;
        pIVar10[1].pos = IVar19;
        pIVar10[1].uv = IVar3;
        pIVar10 = this->_VtxWritePtr;
        pIVar10[1].col = local_38;
        pIVar10 = pIVar10 + 2;
        this->_VtxWritePtr = pIVar10;
        pIVar8 = this->_IdxWritePtr;
        IVar14 = (ImDrawIdx)uVar15;
        *pIVar8 = IVar14;
        pIVar8[1] = IVar5 + (short)iVar9 * 2;
        IVar16 = IVar5 + 1 + (short)iVar9 * 2;
        pIVar8[2] = IVar16;
        pIVar8[3] = IVar16;
        pIVar8[4] = IVar14 + 1;
        pIVar8[5] = IVar14;
        this->_IdxWritePtr = pIVar8 + 6;
        iVar9 = (int)uVar7;
        uVar7 = uVar7 + 1;
        uVar15 = uVar15 + 2;
      } while (uVar11 != uVar7);
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_34 & 0xfffe);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}